

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_concat.cpp
# Opt level: O1

vector<duckdb::Value,_true> *
duckdb::GetListEntries
          (vector<duckdb::Value,_true> *__return_storage_ptr__,vector<duckdb::Value,_true> *keys,
          vector<duckdb::Value,_true> *values)

{
  reference pvVar1;
  size_type __n;
  child_list_t<Value> children;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_b8;
  vector<duckdb::Value,_true> *local_a0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_98;
  pair<const_char_*,_duckdb::Value> local_78;
  
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((keys->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (keys->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    local_a0 = values;
    do {
      local_b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar1 = vector<duckdb::Value,_true>::operator[](keys,__n);
      local_78.first = "key";
      Value::Value(&local_78.second,pvVar1);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
      ::emplace_back<std::pair<char_const*,duckdb::Value>>
                ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                  *)&local_b8,&local_78);
      Value::~Value(&local_78.second);
      pvVar1 = vector<duckdb::Value,_true>::operator[](local_a0,__n);
      local_78.first = "value";
      Value::Value(&local_78.second,pvVar1);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
      ::emplace_back<std::pair<char_const*,duckdb::Value>>
                ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                  *)&local_b8,&local_78);
      Value::~Value(&local_78.second);
      local_98.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_b8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_98.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_b8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_98.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_b8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::STRUCT((Value *)&local_78,(child_list_t<Value> *)&local_98);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)__return_storage_ptr__,
                 (Value *)&local_78);
      Value::~Value((Value *)&local_78);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_98);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_b8);
      __n = __n + 1;
    } while (__n < (ulong)((long)(keys->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                 .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(keys->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>)
                                 .super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 6));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Value> GetListEntries(vector<Value> keys, vector<Value> values) {
	D_ASSERT(keys.size() == values.size());
	vector<Value> entries;
	for (idx_t i = 0; i < keys.size(); i++) {
		child_list_t<Value> children;
		children.emplace_back(make_pair("key", std::move(keys[i])));
		children.emplace_back(make_pair("value", std::move(values[i])));
		entries.push_back(Value::STRUCT(std::move(children)));
	}
	return entries;
}